

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

float * Tim_ManGetReqTimes(Tim_Man_t *p)

{
  uint uVar1;
  Tim_Obj_t *pTVar2;
  int iVar3;
  float *__s;
  int *piVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  uVar1 = p->nCos;
  if ((int)uVar1 < 1) {
    uVar9 = 0;
  }
  else {
    piVar4 = &p->pCos->iObj2Box;
    uVar9 = 0;
    do {
      if ((p->pCos == (Tim_Obj_t *)0x0) ||
         ((*piVar4 < 0 && (((float)piVar4[3] != 1e+09 || (NAN((float)piVar4[3])))))))
      goto LAB_004a3f72;
      uVar9 = uVar9 + 1;
      piVar4 = piVar4 + 6;
    } while (uVar1 != uVar9);
    uVar9 = (ulong)uVar1;
  }
LAB_004a3f72:
  iVar3 = Tim_ManPoNum(p);
  iVar7 = 0;
  if ((int)uVar9 == iVar3) {
    __s = (float *)0x0;
  }
  else {
    lVar8 = (long)p->nCos;
    __s = (float *)malloc(lVar8 * 4);
    memset(__s,0xff,lVar8 * 4);
    if (0 < lVar8) {
      pTVar2 = p->pCos;
      lVar5 = 0;
      iVar7 = 0;
      do {
        if (pTVar2 == (Tim_Obj_t *)0x0) {
          iVar7 = 0;
          break;
        }
        if (*(int *)((long)&pTVar2->iObj2Box + lVar5) < 0) {
          lVar6 = (long)iVar7;
          iVar7 = iVar7 + 1;
          __s[lVar6] = *(float *)((long)&pTVar2->timeArr + lVar5);
        }
        lVar5 = lVar5 + 0x18;
      } while (lVar8 * 0x18 != lVar5);
    }
    iVar3 = Tim_ManPoNum(p);
    if (iVar7 != iVar3) {
      __assert_fail("k == Tim_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timMan.c"
                    ,0x1fe,"float *Tim_ManGetReqTimes(Tim_Man_t *)");
    }
  }
  return __s;
}

Assistant:

float * Tim_ManGetReqTimes( Tim_Man_t * p )
{
    float * pTimes;
    Tim_Obj_t * pObj;
    int i, k = 0;
    Tim_ManForEachPo( p, pObj, i )
        if ( pObj->timeReq != TIM_ETERNITY )
            break;
    if ( i == Tim_ManPoNum(p) )
        return NULL;
    pTimes  = ABC_FALLOC( float, Tim_ManCoNum(p) );
    Tim_ManForEachPo( p, pObj, i )
        pTimes[k++] = pObj->timeArr;
    assert( k == Tim_ManPoNum(p) );
    return pTimes;
}